

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TetrahedralityHBMatrix.cpp
# Opt level: O0

void __thiscall OpenMD::TetrahedralityHBMatrix::initializeHistogram(TetrahedralityHBMatrix *this)

{
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  iterator __first;
  int *in_RDI;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd8;
  uint local_c;
  
  for (local_c = 0; local_c < (uint)in_RDI[0xd]; local_c = local_c + 1) {
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(in_RDI + 0x1d8),(ulong)local_c);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin(in_stack_ffffffffffffffc8);
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  *)(in_RDI + 0x1d8),(ulong)local_c);
    __first = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                        (in_stack_ffffffffffffffc8);
    __last._M_current._4_4_ = 0;
    __last._M_current._0_4_ = in_stack_ffffffffffffffd8;
    std::
    fill<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,int>
              ((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                )__first._M_current,__last,in_RDI);
  }
  return;
}

Assistant:

void TetrahedralityHBMatrix::initializeHistogram() {
    for (unsigned int i = 0; i < nBins_; i++) {
      std::fill(Q_histogram_[i].begin(), Q_histogram_[i].end(), 0);
    }
  }